

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack31_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x7fffffff;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x1f;
  out[1] = uVar1 >> 0x1f | (uVar2 & 0x3fffffff) << 1;
  out[2] = uVar2 >> 0x1e;
  uVar1 = in[2];
  out[2] = uVar2 >> 0x1e | (uVar1 & 0x1fffffff) << 2;
  out[3] = uVar1 >> 0x1d;
  uVar2 = in[3];
  out[3] = uVar1 >> 0x1d | (uVar2 & 0xfffffff) << 3;
  uVar1 = in[4];
  out[4] = uVar2 >> 0x1c;
  out[4] = uVar2 >> 0x1c | (uVar1 & 0x7ffffff) << 4;
  out[5] = uVar1 >> 0x1b;
  uVar2 = in[5];
  out[5] = uVar1 >> 0x1b | (uVar2 & 0x3ffffff) << 5;
  out[6] = uVar2 >> 0x1a;
  uVar1 = in[6];
  out[6] = uVar2 >> 0x1a | (uVar1 & 0x1ffffff) << 6;
  uVar2 = in[7];
  out[7] = uVar1 >> 0x19;
  out[7] = (uVar2 & 0xffffff) << 7 | uVar1 >> 0x19;
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack31_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 31);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 30)) << (31 - 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 29)) << (31 - 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 28)) << (31 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 27)) << (31 - 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 26)) << (31 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 25)) << (31 - 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 24)) << (31 - 24);
  out++;

  return in + 1;
}